

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

int maxdirsterid<cbtVector3>
              (cbtVector3 *p,int count,cbtVector3 *dir,cbtAlignedObjectArray<int> *allow)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar15;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar17;
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  cbtVector3 cVar23;
  cbtVector3 u;
  cbtVector3 local_78;
  cbtVector3 local_68;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar16 [56];
  undefined1 auVar22 [56];
  
  do {
    auVar22 = in_ZMM1._8_56_;
    auVar16 = in_ZMM0._8_56_;
    iVar2 = maxdirfiltered<cbtVector3>(p,count,dir,allow);
    if (allow->m_data[iVar2] == 3) {
      return iVar2;
    }
    cVar23 = orth(dir);
    auVar18._0_8_ = cVar23.m_floats._8_8_;
    auVar18._8_56_ = auVar22;
    auVar12._0_8_ = cVar23.m_floats._0_8_;
    auVar12._8_56_ = auVar16;
    u.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar12._0_16_,auVar18._0_16_);
    uVar15 = u.m_floats._8_8_;
    cVar23 = cbtVector3::cross(&u,dir);
    auVar19._0_8_ = cVar23.m_floats._8_8_;
    auVar19._8_56_ = auVar22;
    local_48 = cVar23.m_floats._0_8_;
    local_58 = auVar19._0_16_;
    in_ZMM1 = ZEXT1664(ZEXT816(0) << 0x40);
    uStack_40 = uVar15;
    iVar5 = -1;
    while( true ) {
      in_ZMM0 = ZEXT464(0x43b40000);
      fVar17 = in_ZMM1._0_4_;
      if (360.0 < fVar17) break;
      fVar7 = sinf(fVar17 * 0.017453292);
      fVar8 = cosf(fVar17 * 0.017453292);
      auVar22 = (undefined1  [56])0x0;
      auVar10._0_4_ = fVar8 * (float)local_48 + fVar7 * u.m_floats[0];
      auVar10._4_4_ = fVar8 * local_48._4_4_ + fVar7 * u.m_floats[1];
      auVar10._8_4_ = fVar8 * (float)uStack_40 + fVar7 * 0.0;
      auVar10._12_4_ = fVar8 * uStack_40._4_4_ + fVar7 * 0.0;
      auVar6._8_4_ = 0x3ccccccd;
      auVar6._0_8_ = 0x3ccccccd3ccccccd;
      auVar6._12_4_ = 0x3ccccccd;
      auVar6 = vmulps_avx512vl(auVar10,auVar6);
      local_78.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar6,ZEXT416((uint)((fVar8 * (float)local_58._0_4_ +
                                               fVar7 * u.m_floats[2]) * 0.025)),0x28);
      auVar16 = ZEXT856(local_78.m_floats._8_8_);
      cVar23 = operator+(dir,&local_78);
      auVar20._0_8_ = cVar23.m_floats._8_8_;
      auVar20._8_56_ = auVar22;
      auVar13._0_8_ = cVar23.m_floats._0_8_;
      auVar13._8_56_ = auVar16;
      local_68.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13._0_16_,auVar20._0_16_);
      iVar3 = maxdirfiltered<cbtVector3>(p,count,&local_68,allow);
      if (iVar3 == iVar2 && iVar5 == iVar2) {
LAB_00e152ff:
        allow->m_data[iVar2] = 3;
        return iVar2;
      }
      if (iVar5 != iVar3 && iVar5 != -1) {
        for (fVar7 = fVar17 + -40.0; fVar7 <= fVar17; fVar7 = fVar7 + 5.0) {
          fVar8 = sinf(fVar7 * 0.017453292);
          fVar9 = cosf(fVar7 * 0.017453292);
          auVar22 = (undefined1  [56])0x0;
          auVar11._0_4_ = fVar9 * (float)local_48 + fVar8 * u.m_floats[0];
          auVar11._4_4_ = fVar9 * local_48._4_4_ + fVar8 * u.m_floats[1];
          auVar11._8_4_ = fVar9 * (float)uStack_40 + fVar8 * 0.0;
          auVar11._12_4_ = fVar9 * uStack_40._4_4_ + fVar8 * 0.0;
          auVar1._8_4_ = 0x3ccccccd;
          auVar1._0_8_ = 0x3ccccccd3ccccccd;
          auVar1._12_4_ = 0x3ccccccd;
          auVar6 = vmulps_avx512vl(auVar11,auVar1);
          local_78.m_floats =
               (cbtScalar  [4])
               vinsertps_avx(auVar6,ZEXT416((uint)((fVar9 * (float)local_58._0_4_ +
                                                   fVar8 * u.m_floats[2]) * 0.025)),0x28);
          auVar16 = ZEXT856(local_78.m_floats._8_8_);
          cVar23 = operator+(dir,&local_78);
          auVar21._0_8_ = cVar23.m_floats._8_8_;
          auVar21._8_56_ = auVar22;
          auVar14._0_8_ = cVar23.m_floats._0_8_;
          auVar14._8_56_ = auVar16;
          local_68.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar14._0_16_,auVar21._0_16_);
          iVar4 = maxdirfiltered<cbtVector3>(p,count,&local_68,allow);
          if (iVar4 == iVar2 && iVar5 == iVar2) goto LAB_00e152ff;
          iVar5 = iVar4;
        }
      }
      in_ZMM1 = ZEXT464((uint)(fVar17 + 45.0));
      iVar5 = iVar3;
    }
    allow->m_data[iVar2] = 0;
  } while( true );
}

Assistant:

int maxdirsterid(const T *p, int count, const T &dir, cbtAlignedObjectArray<int> &allow)
{
	int m = -1;
	while (m == -1)
	{
		m = maxdirfiltered(p, count, dir, allow);
		if (allow[m] == 3) return m;
		T u = orth(dir);
		T v = cbtCross(u, dir);
		int ma = -1;
		for (cbtScalar x = cbtScalar(0.0); x <= cbtScalar(360.0); x += cbtScalar(45.0))
		{
			cbtScalar s = cbtSin(SIMD_RADS_PER_DEG * (x));
			cbtScalar c = cbtCos(SIMD_RADS_PER_DEG * (x));
			int mb = maxdirfiltered(p, count, dir + (u * s + v * c) * cbtScalar(0.025), allow);
			if (ma == m && mb == m)
			{
				allow[m] = 3;
				return m;
			}
			if (ma != -1 && ma != mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for (cbtScalar xx = x - cbtScalar(40.0); xx <= x; xx += cbtScalar(5.0))
				{
					cbtScalar s = cbtSin(SIMD_RADS_PER_DEG * (xx));
					cbtScalar c = cbtCos(SIMD_RADS_PER_DEG * (xx));
					int md = maxdirfiltered(p, count, dir + (u * s + v * c) * cbtScalar(0.025), allow);
					if (mc == m && md == m)
					{
						allow[m] = 3;
						return m;
					}
					mc = md;
				}
			}
			ma = mb;
		}
		allow[m] = 0;
		m = -1;
	}
	cbtAssert(0);
	return m;
}